

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O1

CTcSymbol * CTcSymMetaclassBase::read_from_sym_file(CVmFile *fp)

{
  byte bVar1;
  vm_obj_id_t vVar2;
  CTcPrsSymtab *this;
  int iVar3;
  char *__s;
  size_t sVar4;
  CVmHashEntry *this_00;
  char *siz;
  char b;
  char id [256];
  byte local_139;
  char local_138 [264];
  
  this_00 = (CVmHashEntry *)0x0;
  __s = CTcParser::read_len_prefix_str(fp,local_138,0x51,(size_t *)0x0,0x2db6);
  if (__s != (char *)0x0) {
    CVmFile::read_bytes(fp,(char *)&local_139,1);
    CVmFile::read_bytes(fp,local_138,(ulong)local_139);
    this = G_prs->global_symtab_;
    sVar4 = strlen(__s);
    siz = __s;
    this_00 = (CVmHashEntry *)CTcPrsSymtab::find(this,__s,sVar4,(CTcPrsSymtab **)0x0);
    if ((this_00 == (CVmHashEntry *)0x0) || (*(int *)&this_00->field_0x24 != 9)) {
      this_00 = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x60,(size_t)siz);
      sVar4 = strlen(__s);
      vVar2 = G_cg->next_obj_;
      G_cg->next_obj_ = vVar2 + 1;
      CVmHashEntry::CVmHashEntry(this_00,__s,sVar4,0);
      *(undefined4 *)&this_00->field_0x24 = 9;
      *(undefined4 *)&this_00[1].nxt_ = 0;
      *(undefined4 *)&this_00[2]._vptr_CVmHashEntry = 0;
      this_00[1].str_ = (char *)0x0;
      this_00[1].len_ = 0;
      *(vm_obj_id_t *)((long)&this_00[2]._vptr_CVmHashEntry + 4) = vVar2;
      *(undefined8 *)&this_00[1].field_0x20 = 0;
      this_00[1]._vptr_CVmHashEntry = (_func_int **)0x0;
      bVar1 = *(byte *)&this_00[2].nxt_;
      this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003205d8;
      *(byte *)&this_00[2].nxt_ = (bVar1 & 0xfc) + 1;
      iVar3 = CTcGenTarg::find_or_add_meta
                        (G_cg,local_138,(ulong)local_139,(CTcSymMetaclass *)this_00);
      *(int *)&this_00[1].nxt_ = iVar3;
    }
  }
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *CTcSymMetaclassBase::read_from_sym_file(class CVmFile *fp)
{
    /* read the symbol name */
    const char *txt;
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the metaclass ID string */
    char id[256];
    size_t idlen = (uchar)fp->read_byte();
    fp->read_bytes(id, idlen);

    /* if the symbol is already defined, return the existing copy */
    CTcSymbol *old_sym = G_prs->get_global_symtab()->find(txt, strlen(txt));
    if (old_sym != 0 && old_sym->get_type() == TC_SYM_METACLASS)
        return old_sym;

    /* create a new external metaclass symbol */
    CTcSymMetaclass *sym = new CTcSymMetaclass(
        txt, strlen(txt), FALSE, 0, G_cg->new_obj_id());

    /* mark it as external */
    sym->set_ext(TRUE);

    /* add it to the metaclass table */
    int idx = G_cg->find_or_add_meta(id, idlen, sym);

    /* set the index in the symbol */
    sym->set_meta_idx(idx);

    /* return the new symbol */
    return sym;
}